

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  SnapPromiseCapabilityInfo *capabilityInfo;
  bool bVar1;
  ScriptContext *ctx;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  RecyclableObject *pRVar2;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *local_50;
  JavascriptPromiseCapability *local_48;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *local_40;
  TTDVar local_38;
  
  if (snpObject->SnapObjectTag == SnapPromiseAllSettledResolveOrRejectElementFunctionObject) {
    capabilityInfo = (SnapPromiseCapabilityInfo *)snpObject->AddtlSnapObjectInfo;
    ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
    local_48 = NSSnapValues::InflatePromiseCapabilityInfo(capabilityInfo,ctx,inflator);
    local_38 = capabilityInfo[1].PromiseVar;
    this = &inflator->m_promiseDataMap;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this,(unsigned_long *)&local_38);
    if (!bVar1) {
      local_50 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                           ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                            *(uint32 *)&capabilityInfo[1].ResolveVar);
      local_38 = capabilityInfo[1].PromiseVar;
      JsUtil::
      BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this,(unsigned_long *)&local_38,&local_50);
    }
    local_38 = capabilityInfo[1].PromiseVar;
    local_40 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
               JsUtil::
               BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(this,(unsigned_long *)&local_38);
    local_38 = capabilityInfo[1].RejectVar;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this,(unsigned_long *)&local_38);
    if (!bVar1) {
      local_50 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
                 Js::JavascriptLibrary::CreateAlreadyCalledWrapper_TTD
                           ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                            SUB81(capabilityInfo[2].CapabilityId,0));
      local_38 = capabilityInfo[1].RejectVar;
      JsUtil::
      BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this,(unsigned_long *)&local_38,&local_50);
    }
    local_38 = capabilityInfo[1].RejectVar;
    alreadyCalledWrapper =
         (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
         JsUtil::
         BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         ::Item(this,(unsigned_long *)&local_38);
    pRVar2 = InflateMap::LookupObject(inflator,(TTD_PTR_ID)capabilityInfo[2].PromiseVar);
    pRVar2 = Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,local_48,
                        (uint32)capabilityInfo[1].CapabilityId,local_40,pRVar2,alreadyCalledWrapper,
                        *(bool *)((long)&capabilityInfo[2].CapabilityId + 1));
    return pRVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId))
            {
                Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = ctx->GetLibrary()->CreateAlreadyCalledWrapper_TTD(ctx, aInfo->AlreadyCalledValue);
                inflator->AddInflatedPromiseInfo(aInfo->AlreadyCalledWrapperId, alreadyCalledWrapper);
            }
            Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllSettledResolveOrRejectElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, alreadyCalledWrapper, aInfo->IsRejecting);
        }